

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uenum.cpp
# Opt level: O3

int32_t uenum_count_63(UEnumeration *en,UErrorCode *status)

{
  int32_t iVar1;
  
  if ((en != (UEnumeration *)0x0) && (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
    if (en->count != (UEnumCount *)0x0) {
      iVar1 = (*en->count)(en,status);
      return iVar1;
    }
    *status = U_UNSUPPORTED_ERROR;
  }
  return -1;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uenum_count(UEnumeration* en, UErrorCode* status)
{
    if (!en || U_FAILURE(*status)) {
        return -1;
    }
    if (en->count != NULL) {
        return en->count(en, status);
    } else {
        *status = U_UNSUPPORTED_ERROR;
        return -1;
    }
}